

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-expression.c
# Opt level: O2

_Bool expression_test_copy(expression_t *a,expression_t *b)

{
  expression_operation_t *peVar1;
  expression_operation_t *peVar2;
  bool bVar3;
  size_t sVar4;
  
  if ((b == (expression_t *)0x0 || a == (expression_t *)0x0) ||
     (a->operation_count != b->operation_count)) {
    bVar3 = false;
  }
  else {
    peVar1 = a->operations;
    peVar2 = b->operations;
    bVar3 = (peVar1 != peVar2 && a != b) &&
            (a->operations_size == b->operations_size && a->base_value == b->base_value);
    for (sVar4 = 0; a->operation_count != sVar4; sVar4 = sVar4 + 1) {
      bVar3 = (bool)(bVar3 & (peVar1[sVar4].operator == peVar2[sVar4].operator &&
                             peVar1[sVar4].operand == peVar2[sVar4].operand));
    }
  }
  return bVar3;
}

Assistant:

bool expression_test_copy(const expression_t *a, const expression_t *b)
{
	size_t i;
	bool success = true;

	if (a == NULL || b == NULL)
		return false;

	success &= (a != b);
	success &= (a->base_value == b->base_value);
	success &= (a->operation_count == b->operation_count);
	success &= (a->operations_size == b->operations_size);
	success &= (a->operations != b->operations);

	if (a->operation_count != b->operation_count)
		return false;

	for (i = 0; i < a->operation_count; i++) {
		success &= (a->operations[i].operand == b->operations[i].operand);
		success &= (a->operations[i].operator == b->operations[i].operator);
	}

	return success;
}